

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PieceType.h
# Opt level: O2

optional<libchess::PieceType> libchess::PieceType::from(char c)

{
  ulong uVar1;
  undefined3 in_register_00000039;
  int iVar2;
  ulong uStack_8;
  
  iVar2 = CONCAT31(in_register_00000039,c);
  uVar1 = 0x100000000;
  uStack_8 = 0;
  switch(iVar2) {
  case 0x4b:
switchD_00106caa_caseD_6b:
    uStack_8 = 5;
    break;
  case 0x4e:
switchD_00106caa_caseD_6e:
    uStack_8 = 1;
  case 0x50:
    break;
  case 0x51:
switchD_00106caa_caseD_71:
    uStack_8 = 4;
    break;
  case 0x52:
switchD_00106caa_caseD_72:
    uStack_8 = 3;
    break;
  default:
    uStack_8 = 0;
    switch(iVar2) {
    case 0x6b:
      goto switchD_00106caa_caseD_6b;
    case 0x6c:
    case 0x6d:
    case 0x6f:
      break;
    case 0x6e:
      goto switchD_00106caa_caseD_6e;
    case 0x70:
      goto switchD_00106caa_caseD_70;
    case 0x71:
      goto switchD_00106caa_caseD_71;
    case 0x72:
      goto switchD_00106caa_caseD_72;
    default:
      if ((iVar2 == 0x42) || (iVar2 == 0x62)) {
        uStack_8 = 2;
        goto switchD_00106caa_caseD_70;
      }
    }
  case 0x4c:
  case 0x4d:
  case 0x4f:
    uStack_8 = 0;
    uVar1 = 0;
  }
switchD_00106caa_caseD_70:
  return (optional<libchess::PieceType>)(uStack_8 | uVar1);
}

Assistant:

constexpr static std::optional<PieceType> from(char c) {
        switch (c) {
        case 'p':
        case 'P':
            return PieceType{Value::PAWN};
        case 'n':
        case 'N':
            return PieceType{Value::KNIGHT};
        case 'b':
        case 'B':
            return PieceType{Value::BISHOP};
        case 'r':
        case 'R':
            return PieceType{Value::ROOK};
        case 'q':
        case 'Q':
            return PieceType{Value::QUEEN};
        case 'k':
        case 'K':
            return PieceType{Value::KING};
        default:
            return {};
        }
    }